

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O0

void __thiscall
despot::option::PrintUsageImplementation::LineWrapper::process
          (LineWrapper *this,IStringWriter *write,char *data,int len)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  uint local_3c;
  int i;
  uint mask;
  uint ch;
  int charbytes;
  int maxi;
  int utf8width;
  int len_local;
  char *data_local;
  IStringWriter *write_local;
  LineWrapper *this_local;
  
  this->wrote_something = false;
  maxi = len;
  _utf8width = data;
LAB_002197d6:
  while( true ) {
    if (maxi < 1) {
      if ((this->wrote_something & 1U) == 0) {
        write_one_line(this,write);
      }
      return;
    }
    if (this->width < maxi) break;
    output(this,write,_utf8width,maxi);
    maxi = 0;
  }
  charbytes = 0;
  ch = 0;
  do {
    bVar2 = false;
    if ((int)ch < maxi) {
      bVar2 = charbytes < this->width;
    }
    if (!bVar2) break;
    mask = 1;
    uVar3 = (uint)(byte)_utf8width[(int)ch];
    if (0xc1 < uVar3) {
      iVar1 = 0x1f;
      if ((uVar3 ^ 0xff) != 0) {
        for (; (uVar3 ^ 0xff) >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      i = uVar3 & 0xffffffffU >> (((byte)iVar1 ^ 0x1f) & 0x1f);
      while( true ) {
        bVar2 = false;
        if ((int)(ch + mask) < maxi) {
          bVar2 = (byte)(_utf8width[(int)(ch + mask)] ^ 0x80U) < 0x40;
        }
        if (!bVar2) break;
        i = i << 6 ^ (uint)(byte)_utf8width[(int)(ch + mask)] ^ 0x80;
        mask = mask + 1;
      }
      if ((0x10ff < (uint)i) && (bVar2 = isWideChar(i), bVar2)) {
        if (this->width < charbytes + 2) break;
        charbytes = charbytes + 1;
      }
    }
    charbytes = charbytes + 1;
    ch = mask + ch;
  } while( true );
  if (ch == maxi) {
    output(this,write,_utf8width,maxi);
    maxi = 0;
  }
  else {
    for (local_3c = ch; (-1 < (int)local_3c && (_utf8width[(int)local_3c] != ' '));
        local_3c = local_3c - 1) {
    }
    if ((int)local_3c < 0) {
      output(this,write,_utf8width,ch);
    }
    else {
      output(this,write,_utf8width,local_3c);
      ch = local_3c + 1;
    }
    _utf8width = _utf8width + (int)ch;
    maxi = maxi - ch;
  }
  goto LAB_002197d6;
}

Assistant:

void process(IStringWriter& write, const char* data, int len) {
			wrote_something = false;

			while (len > 0) {
				if (len <= width) // quick test that works because utf8width <= len (all wide chars have at least 2 bytes)
					{
					output(write, data, len);
					len = 0;
				} else // if (len > width)  it's possible (but not guaranteed) that utf8len > width
				{
					int utf8width = 0;
					int maxi = 0;
					while (maxi < len && utf8width < width) {
						int charbytes = 1;
						unsigned ch = (unsigned char) data[maxi];
						if (ch > 0xC1) // everything <= 0xC1 (yes, even 0xC1 itself) is not a valid UTF-8 start byte
							{
							// int __builtin_clz (unsigned int x)
							// Returns the number of leading 0-bits in x, starting at the most significant bit
							unsigned mask = (unsigned) -1
								>> __builtin_clz(ch ^ 0xff);
							ch = ch & mask; // mask out length bits, we don't verify their correctness
							while ((maxi + charbytes < len) && //
								(((unsigned char) data[maxi + charbytes] ^ 0x80)
									<= 0x3F)) // while next byte is continuation byte
							{
								ch = (ch << 6)
									^ (unsigned char) data[maxi + charbytes]
									^ 0x80; // add continuation to char code
								++charbytes;
							}
							// ch is the decoded unicode code point
							if (ch >= 0x1100 && isWideChar(ch)) // the test for 0x1100 is here to avoid the function call in the Latin case
								{
								if (utf8width + 2 > width)
									break;
								++utf8width;
							}
						}
						++utf8width;
						maxi += charbytes;
					}

					// data[maxi-1] is the last byte of the UTF-8 sequence of the last character that fits
					// onto the 1st line. If maxi == len, all characters fit on the line.

					if (maxi == len) {
						output(write, data, len);
						len = 0;
					} else // if (maxi < len)  at least 1 character (data[maxi] that is) doesn't fit on the line
					{
						int i;
						for (i = maxi; i >= 0; --i)
							if (data[i] == ' ')
								break;

						if (i >= 0) {
							output(write, data, i);
							data += i + 1;
							len -= i + 1;
						} else // did not find a space to split at => split before data[maxi]
						{ // data[maxi] is always the beginning of a character, never a continuation byte
							output(write, data, maxi);
							data += maxi;
							len -= maxi;
						}
					}
				}
			}
			if (!wrote_something) // if we didn't already write something to make space in the buffer
				write_one_line(write); // write at most one line of actual output
		}